

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O1

int run_test_udp_send_unix(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  undefined8 uVar3;
  long *plVar4;
  int64_t eval_b_4;
  int64_t eval_b_6;
  uv_buf_t buf;
  sockaddr_un addr;
  uv_udp_t handle;
  uv_udp_send_t req;
  long local_2a8;
  long local_2a0;
  undefined1 local_298 [16];
  sockaddr local_288;
  undefined2 local_278;
  undefined1 uStack_276;
  undefined5 uStack_275;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined6 uStack_230;
  undefined2 uStack_22a;
  undefined6 uStack_228;
  undefined8 uStack_222;
  undefined8 local_210 [23];
  long local_158 [41];
  
  local_298 = uv_buf_init("PING",4);
  uVar3 = uv_default_loop();
  uStack_275 = 0;
  uStack_270 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_258 = 0;
  uStack_250 = 0;
  local_248 = 0;
  uStack_240 = 0;
  local_238 = 0;
  uStack_230 = 0;
  uStack_22a = 0;
  uStack_228 = 0;
  uStack_222 = 0;
  local_288.sa_family = 1;
  local_158[0] = 0x11;
  local_210[0] = 0x6c;
  builtin_strncpy(local_288.sa_data,"/tmp/uv-test-s",0xe);
  local_278 = 0x636f;
  uStack_276 = 0x6b;
  iVar1 = socket(1,1,0);
  local_158[0] = (long)iVar1;
  local_210[0] = 0;
  if (local_158[0] < 0) {
    local_210[0] = 0;
    run_test_udp_send_unix_cold_8();
LAB_001dfbd2:
    run_test_udp_send_unix_cold_2();
LAB_001dfbe7:
    run_test_udp_send_unix_cold_3();
LAB_001dfbfc:
    run_test_udp_send_unix_cold_4();
LAB_001dfc0c:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    iVar2 = bind(iVar1,&local_288,0x6e);
    local_158[0] = (long)iVar2;
    local_210[0] = 0;
    if (local_158[0] != 0) goto LAB_001dfbd2;
    iVar2 = listen(iVar1,1);
    local_158[0] = (long)iVar2;
    local_210[0] = 0;
    if (local_158[0] != 0) goto LAB_001dfbe7;
    iVar2 = uv_udp_init(uVar3,local_210);
    local_158[0] = (long)iVar2;
    local_2a8 = 0;
    if (local_158[0] != 0) goto LAB_001dfbfc;
    iVar2 = uv_udp_open(local_210,iVar1);
    local_158[0] = (long)iVar2;
    local_2a8 = 0;
    if (local_158[0] != 0) goto LAB_001dfc0c;
    uv_run(uVar3,0);
    iVar2 = uv_udp_send(local_158,local_210,local_298,1,&local_288,0);
    local_2a8 = (long)iVar2;
    local_2a0 = 0;
    if (local_2a8 == 0) {
      uv_close(local_210,0);
      uv_run(uVar3,0);
      close(iVar1);
      unlink("/tmp/uv-test-sock");
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      local_2a8 = 0;
      iVar1 = uv_loop_close(uVar3);
      local_2a0 = (long)iVar1;
      if (local_2a8 == local_2a0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001dfc29;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_001dfc29:
  plVar4 = &local_2a8;
  run_test_udp_send_unix_cold_7();
  if (plVar4 != (long *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(plVar4,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_send_unix) {
  /* Test that "uv_udp_send()" supports sending over
     a "sockaddr_un" address. */
  struct sockaddr_un addr;
  uv_udp_t handle;
  uv_udp_send_t req;
  uv_loop_t* loop;
  uv_buf_t buf = uv_buf_init("PING", 4);
  int fd;
  int r;

  loop = uv_default_loop();

  memset(&addr, 0, sizeof addr);
  addr.sun_family = AF_UNIX;
  ASSERT_LT(strlen(TEST_PIPENAME), sizeof(addr.sun_path));
  memcpy(addr.sun_path, TEST_PIPENAME, strlen(TEST_PIPENAME));

  fd = socket(AF_UNIX, SOCK_STREAM, 0);
  ASSERT_GE(fd, 0);

  unlink(TEST_PIPENAME);
  ASSERT_OK(bind(fd, (const struct sockaddr*)&addr, sizeof addr));
  ASSERT_OK(listen(fd, 1));

  r = uv_udp_init(loop, &handle);
  ASSERT_OK(r);
  r = uv_udp_open(&handle, fd);
  ASSERT_OK(r);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_udp_send(&req,
                  &handle,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  NULL);
  ASSERT_OK(r);

  uv_close((uv_handle_t*)&handle, NULL);
  uv_run(loop, UV_RUN_DEFAULT);
  close(fd);
  unlink(TEST_PIPENAME);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}